

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O1

void __thiscall backward::Colorize::activate(Colorize *this,type mode,FILE *fp)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = fileno((FILE *)fp);
  if (mode == automatic) {
    iVar1 = isatty(iVar1);
    bVar2 = true;
    if (iVar1 != 0) goto LAB_00108df1;
  }
  bVar2 = mode == always;
LAB_00108df1:
  this->_enabled = bVar2;
  return;
}

Assistant:

void activate(ColorMode::type mode, FILE *fp) { activate(mode, fileno(fp)); }